

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

SorterRecord * vdbeSorterMerge(SortSubtask *pTask,SorterRecord *p1,SorterRecord *p2)

{
  int iVar1;
  undefined4 local_34;
  int res;
  int bCached;
  SorterRecord **pp;
  SorterRecord *pFinal;
  SorterRecord *p2_local;
  SorterRecord *p1_local;
  SortSubtask *pTask_local;
  
  pp = (SorterRecord **)0x0;
  _res = (anon_union_8_2_0134e7e8_for_u *)&pp;
  local_34 = 0;
  pFinal = p2;
  p2_local = p1;
  p1_local = (SorterRecord *)pTask;
  do {
    while (iVar1 = (**(code **)(p1_local + 4))
                             (p1_local,&local_34,p2_local + 1,p2_local->nVal,pFinal + 1,pFinal->nVal
                             ), 0 < iVar1) {
      _res->pNext = pFinal;
      _res = &pFinal->u;
      pFinal = (pFinal->u).pNext;
      local_34 = 0;
      if (pFinal == (SorterRecord *)0x0) {
        _res->pNext = p2_local;
        return (SorterRecord *)pp;
      }
    }
    _res->pNext = p2_local;
    _res = &p2_local->u;
    p2_local = (p2_local->u).pNext;
  } while (p2_local != (SorterRecord *)0x0);
  _res->pNext = pFinal;
  return (SorterRecord *)pp;
}

Assistant:

static SorterRecord *vdbeSorterMerge(
  SortSubtask *pTask,             /* Calling thread context */
  SorterRecord *p1,               /* First list to merge */
  SorterRecord *p2                /* Second list to merge */
){
  SorterRecord *pFinal = 0;
  SorterRecord **pp = &pFinal;
  int bCached = 0;

  assert( p1!=0 && p2!=0 );
  for(;;){
    int res;
    res = pTask->xCompare(
        pTask, &bCached, SRVAL(p1), p1->nVal, SRVAL(p2), p2->nVal
    );

    if( res<=0 ){
      *pp = p1;
      pp = &p1->u.pNext;
      p1 = p1->u.pNext;
      if( p1==0 ){
        *pp = p2;
        break;
      }
    }else{
      *pp = p2;
      pp = &p2->u.pNext;
      p2 = p2->u.pNext;
      bCached = 0;
      if( p2==0 ){
        *pp = p1;
        break;
      }
    }
  }
  return pFinal;
}